

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

char * Strings::ulltoa(uint64 value,char *result,int base)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  
  if (base - 0x25U < 0xffffffdd) {
    *result = '\0';
  }
  else {
    uVar4 = (ulong)(uint)base;
    pcVar2 = result + -1;
    do {
      pcVar3 = pcVar2;
      pcVar3[1] = "zyxwvutsrqponmlkjihgfedcba9876543210123456789abcdefghijklmnopqrstuvwxyz"
                  [(value - (value / uVar4) * uVar4) + 0x23];
      bVar5 = uVar4 <= value;
      pcVar2 = pcVar3 + 1;
      value = value / uVar4;
    } while (bVar5);
    pcVar3[2] = '\0';
    pcVar2 = result;
    if (result < pcVar3 + 1) {
      do {
        cVar1 = pcVar3[1];
        pcVar3[1] = *pcVar2;
        *pcVar2 = cVar1;
        bVar5 = pcVar2 + 1 < pcVar3;
        pcVar2 = pcVar2 + 1;
        pcVar3 = pcVar3 + -1;
      } while (bVar5);
    }
  }
  return result;
}

Assistant:

char* ulltoa(uint64 value, char* result, int base)
    {
        if (base < 2 || base > 36) { *result = '\0'; return result; }
        char* ptr = result, *ptr1 = result, tmp_char;
        uint64 tmp_value;
        do {
            tmp_value = value;
            value /= base;
            *ptr++ = "zyxwvutsrqponmlkjihgfedcba9876543210123456789abcdefghijklmnopqrstuvwxyz" [35 + (tmp_value - value * base)];
        } while ( value );
        *ptr-- = '\0';
        // Then swap and reorder first to last
        while(ptr1 < ptr) {
            tmp_char = *ptr;
            *ptr--= *ptr1;
            *ptr1++ = tmp_char;
        }
        return result;
    }